

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O1

pcp_flow_t *
pcp_new_flow(pcp_ctx_t *ctx,sockaddr *src_addr,sockaddr *dst_addr,sockaddr *ext_addr,
            uint8_t protocol,uint32_t lifetime,void *userdata)

{
  int iVar1;
  int iVar2;
  pcp_flow_s *ppVar3;
  bool bVar4;
  pcp_flow_t *f;
  undefined1 auVar5 [8];
  undefined1 auVar6 [8];
  pcp_errno pVar7;
  sockaddr_storage tmp_ext_addr;
  caasi_data data;
  undefined1 local_148 [8];
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined1 auStack_110 [12];
  undefined8 uStack_104;
  pcp_ctx_t *local_f8;
  sockaddr local_f0;
  undefined8 uStack_e0;
  undefined1 *local_70;
  undefined8 local_68;
  pcp_flow_t *ppStack_60;
  uint32_t local_58;
  sockaddr *local_50;
  void *local_38;
  
  local_148 = (undefined1  [8])0x0;
  uStack_140 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  auStack_110._0_4_ = 0;
  auStack_110._4_4_ = 0;
  auStack_110._8_4_ = 0;
  uStack_104 = 0;
  if (ctx == (pcp_ctx_t *)0x0 || src_addr == (sockaddr *)0x0) {
    return (pcp_flow_t *)0x0;
  }
  local_f8 = ctx;
  pcp_fill_in6_addr((in6_addr *)(local_148 + 4),(uint16_t *)((long)&local_118 + 6),
                    (uint32_t *)((long)&local_128 + 4),src_addr);
  local_118._0_5_ = CONCAT14(protocol,(undefined4)local_118);
  if (dst_addr == (sockaddr *)0x0) {
LAB_00102de4:
    dst_addr = (sockaddr *)(sockaddr_in6 *)0x0;
  }
  else if (dst_addr->sa_family == 10) {
    if ((*(int *)(dst_addr->sa_data + 6) == 0) &&
       ((((*(int *)(dst_addr->sa_data + 10) == 0 &&
          (iVar1._0_2_ = dst_addr[1].sa_family, iVar1._2_1_ = dst_addr[1].sa_data[0],
          iVar1._3_1_ = dst_addr[1].sa_data[1], iVar1 == 0)) &&
         (*(int *)(dst_addr[1].sa_data + 2) == 0)) ||
        ((((*(int *)(dst_addr->sa_data + 10) == 0 &&
           (iVar2._0_2_ = dst_addr[1].sa_family, iVar2._2_1_ = dst_addr[1].sa_data[0],
           iVar2._3_1_ = dst_addr[1].sa_data[1], iVar2 == -0x10000)) &&
          ((dst_addr[1].sa_data[2] == '\0' &&
           ((dst_addr[1].sa_data[3] == '\0' && (dst_addr[1].sa_data[4] == '\0')))))) &&
         (dst_addr[1].sa_data[5] == '\0')))))) goto LAB_00102de4;
  }
  else {
    if (dst_addr->sa_family != 2) goto LAB_00102de4;
    if (*(int *)(dst_addr->sa_data + 2) == 0) {
      dst_addr = (sockaddr *)(sockaddr_in6 *)0x0;
    }
  }
  if ((sockaddr_in6 *)dst_addr == (sockaddr_in6 *)0x0) {
    local_148[0] = 1;
  }
  else {
    pcp_fill_in6_addr((in6_addr *)auStack_110,(uint16_t *)((long)&uStack_104 + 4),(uint32_t *)0x0,
                      dst_addr);
    auVar5 = local_148;
    local_148[0] = 2;
    auVar6 = local_148;
    if (src_addr->sa_family == 2) {
      local_148 = auVar6;
      if ((int)local_138 == 0) {
        findsaddr((sockaddr_in *)dst_addr,(in6_addr *)(local_148 + 4));
      }
    }
    else {
      local_148._4_4_ = auVar5._4_4_;
      if (((((int)uStack_140 == 0 && local_148._4_4_ == 0) && (uStack_140._4_4_ == 0)) &&
          ((int)local_138 == 0)) ||
         (((((int)uStack_140 == 0 && local_148._4_4_ == 0) && uStack_140._4_4_ == -0x10000 &&
           ((char)local_138 == '\0')) &&
          ((local_138._1_1_ == '\0' && ((local_138._2_1_ == '\0' && (local_138._3_1_ == '\0'))))))))
      {
        local_148 = auVar6;
        findsaddr6((sockaddr_in6 *)dst_addr,(in6_addr *)(local_148 + 4),
                   (uint32_t *)((long)&local_128 + 4));
      }
      else {
        local_148 = auVar6;
        if (((sockaddr_in6 *)dst_addr)->sin6_family != src_addr->sa_family) {
          return (pcp_flow_t *)0x0;
        }
      }
    }
  }
  if (ext_addr != (sockaddr *)0x0) goto LAB_00102ee3;
  local_f0.sa_family = src_addr->sa_family;
  if (local_f0.sa_family == 10) {
    local_f0.sa_data[6] = '\0';
    local_f0.sa_data[7] = '\0';
    local_f0.sa_data[8] = '\0';
    local_f0.sa_data[9] = '\0';
    local_f0.sa_data[10] = '\0';
    local_f0.sa_data[0xb] = '\0';
    local_f0.sa_data[0xc] = '\0';
    local_f0.sa_data[0xd] = '\0';
    uStack_e0 = 0;
LAB_00102eca:
    ext_addr = &local_f0;
    local_f0.sa_data[0] = '\0';
    local_f0.sa_data[1] = '\0';
    bVar4 = true;
  }
  else {
    if (local_f0.sa_family == 2) {
      local_f0.sa_data[2] = '\0';
      local_f0.sa_data[3] = '\0';
      local_f0.sa_data[4] = '\0';
      local_f0.sa_data[5] = '\0';
      goto LAB_00102eca;
    }
    bVar4 = false;
    ext_addr = (sockaddr *)0x0;
  }
  if (!bVar4) {
    return (pcp_flow_t *)0x0;
  }
LAB_00102ee3:
  local_68 = 0;
  ppStack_60 = (pcp_flow_t *)0x0;
  local_38 = userdata;
  local_70 = local_148;
  local_58 = lifetime;
  local_50 = ext_addr;
  pVar7 = pcp_db_foreach_server(local_f8,chain_and_assign_src_ip,&local_70);
  f = ppStack_60;
  if (pVar7 != PCP_ERR_MAX_SIZE) {
    while (f != (pcp_flow_t *)0x0) {
      ppVar3 = f->next_child;
      pcp_delete_flow_intern(f);
      f = ppVar3;
    }
    return (pcp_flow_t *)0x0;
  }
  return ppStack_60;
}

Assistant:

pcp_flow_t *pcp_new_flow(pcp_ctx_t *ctx, struct sockaddr *src_addr,
                         struct sockaddr *dst_addr, struct sockaddr *ext_addr,
                         uint8_t protocol, uint32_t lifetime, void *userdata) {
    struct flow_key_data kd;
    struct caasi_data data;
    struct sockaddr_storage tmp_ext_addr;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    memset(&kd, 0, sizeof(kd));

    if ((!src_addr) || (!ctx)) {
        return NULL;
    }
    pcp_fill_in6_addr(&kd.src_ip, &kd.map_peer.src_port, &kd.scope_id,
                      src_addr);

    kd.map_peer.protocol = protocol;

    if (dst_addr) {
        switch (dst_addr->sa_family) {
        case AF_INET:
            if (((struct sockaddr_in *)(dst_addr))->sin_addr.s_addr ==
                INADDR_ANY) {
                dst_addr = NULL;
            }
            break;
        case AF_INET6:
            if (IPV6_IS_ADDR_ANY(
                    &((struct sockaddr_in6 *)(dst_addr))->sin6_addr)) {
                dst_addr = NULL;
            }
            break;
        default:
            dst_addr = NULL;
            break;
        }
    }

    if (dst_addr) {
        pcp_fill_in6_addr(&kd.map_peer.dst_ip, &kd.map_peer.dst_port, NULL,
                          dst_addr);
        kd.operation = PCP_OPCODE_PEER;
        if (src_addr->sa_family == AF_INET) {
            if (S6_ADDR32(&kd.src_ip)[3] == INADDR_ANY) {
                findsaddr((struct sockaddr_in *)dst_addr, &kd.src_ip);
            }
        } else if (IPV6_IS_ADDR_ANY(&kd.src_ip)) {
            findsaddr6((struct sockaddr_in6 *)dst_addr, &kd.src_ip,
                       &kd.scope_id);
        } else if (dst_addr->sa_family != src_addr->sa_family) {
            PCP_LOG(PCP_LOGLVL_PERR, "%s", "Socket family mismatch.");

            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return NULL;
        }
    } else {
        kd.operation = PCP_OPCODE_MAP;
    }

    if (!ext_addr) {
        struct sockaddr_in *te4 = (struct sockaddr_in *)&tmp_ext_addr;
        struct sockaddr_in6 *te6 = (struct sockaddr_in6 *)&tmp_ext_addr;
        tmp_ext_addr.ss_family = src_addr->sa_family;
        switch (tmp_ext_addr.ss_family) {
        case AF_INET:
            memset(&te4->sin_addr, 0, sizeof(te4->sin_addr));
            te4->sin_port = 0;
            break;
        case AF_INET6:
            memset(&te6->sin6_addr, 0, sizeof(te6->sin6_addr));
            te6->sin6_port = 0;
            break;
        default:
            PCP_LOG(PCP_LOGLVL_PERR, "%s", "Unsupported address family.");
            return NULL;
        }
        ext_addr = (struct sockaddr *)&tmp_ext_addr;
    }

    data.fprev = NULL;
    data.lifetime = lifetime;
    data.ext_addr = ext_addr;
    data.kd = &kd;
    data.ffirst = NULL;
    data.userdata = userdata;

    if (pcp_db_foreach_server(ctx, chain_and_assign_src_ip, &data) !=
        PCP_ERR_MAX_SIZE) { // didn't iterate through each server => error
                            // happened
        pcp_delete_flow(data.ffirst);
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return NULL;
    }

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return data.ffirst;
}